

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O2

uint Dau_DecReadSet(char *pStr)

{
  char cVar1;
  uint uVar2;
  uint in_R8D;
  
  uVar2 = 0;
  do {
    cVar1 = *pStr;
    if (cVar1 == '\0') {
      return uVar2;
    }
    if ((byte)(cVar1 + 0x9fU) < 0x1a) {
      in_R8D = 1 << ((cVar1 + 0x9fU) * '\x02' & 0x1f);
    }
    else if (0x19 < (byte)(cVar1 + 0xbfU)) {
      return uVar2;
    }
    uVar2 = uVar2 | in_R8D;
    pStr = pStr + 1;
  } while( true );
}

Assistant:

unsigned Dau_DecReadSet( char * pStr )
{
    unsigned uSet = 0; int v;
    for ( v = 0; pStr[v]; v++ )
    {
        if ( pStr[v] >= 'a' && pStr[v] <= 'z' )
            uSet |= (1 << ((pStr[v] - 'a') << 1));
        else if ( pStr[v] >= 'A' && pStr[v] <= 'Z' )
            uSet |= (1 << ((pStr[v] - 'a') << 1)) | (1 << (((pStr[v] - 'a') << 1)+1));
        else break;
    }
    return uSet;
}